

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_lu.c
# Opt level: O2

_Bool test_lu_invmul_x(_Bool inplace,int n_row,int n_col,int N,int field)

{
  undefined8 uVar1;
  int n_row_00;
  long lVar2;
  long lVar3;
  uint8_t mask;
  int iVar4;
  ulong uVar5;
  int *cp;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint8_t *m;
  uint8_t *puVar9;
  int *rp;
  uint N_00;
  undefined7 in_register_00000039;
  int iVar10;
  int i;
  int r1;
  int *piVar11;
  int aiStack_120 [2];
  int aiStack_118 [2];
  undefined1 local_110 [8];
  m256v X;
  m256v X1;
  m256v A;
  undefined1 local_78 [8];
  m256v Y;
  
  Y.e._0_4_ = (undefined4)CONCAT71(in_register_00000039,inplace);
  n_row_00 = n_col;
  if (n_col < n_row) {
    n_row_00 = n_row;
  }
  mask = get_mask(N);
  N_00 = n_col * 4;
  uVar8 = 0;
  iVar10 = 0;
  if (0 < n_col) {
    iVar10 = n_col;
  }
  uVar5 = (ulong)N_00 + 0xf & 0xfffffffffffffff0;
  uVar6 = (ulong)(uint)n_row * 4 + 0xf & 0xfffffffffffffff0;
  uVar7 = (ulong)(uint)n_col * 4 + 0xf & 0xfffffffffffffff0;
  do {
    if (uVar8 == 10000) {
LAB_0010213b:
      return 9999 < uVar8;
    }
    lVar2 = -((ulong)(uint)(n_col * n_row) + 0xf & 0xfffffffffffffff0);
    m = (uint8_t *)((long)aiStack_118 + lVar2);
    *(undefined8 *)((long)aiStack_120 + lVar2) = 0x101eeb;
    rand_coeffs(m,n_col * n_row,mask);
    *(undefined8 *)((long)aiStack_120 + lVar2) = 0x101efd;
    m256v_make((m256v *)&X1.e,n_row,n_col,m);
    lVar2 = -uVar5;
    puVar9 = m + lVar2;
    builtin_memcpy(m + lVar2 + -8,"\x18\x1f\x10",4);
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    rand_coeffs(puVar9,N_00,mask);
    puVar9[-8] = '\x04';
    puVar9[-7] = '\0';
    puVar9[-6] = '\0';
    puVar9[-5] = '\0';
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    uVar1 = *(undefined8 *)(puVar9 + -8);
    builtin_memcpy(m + lVar2 + -8,"5\x1f\x10",4);
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    m256v_make((m256v *)local_110,n_col,(int)uVar1,puVar9);
    lVar3 = -((ulong)(uint)(n_row_00 * 4) + 0xf & 0xfffffffffffffff0);
    puVar9 = puVar9 + lVar3;
    builtin_memcpy(m + lVar3 + lVar2 + -8,"W\x1f\x10",4);
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    m256v_make((m256v *)local_78,n_row_00,(int)uVar1,puVar9);
    local_78._0_4_ = n_row;
    builtin_memcpy(m + lVar3 + lVar2 + -8,"v\x1f\x10",4);
    puVar9[-4] = '\0';
    puVar9[-3] = '\0';
    puVar9[-2] = '\0';
    puVar9[-1] = '\0';
    m256v_mul((m256v *)&X1.e,(m256v *)local_110,(m256v *)local_78);
    rp = (int *)(puVar9 + -uVar6);
    cp = (int *)((long)rp - uVar7);
    cp[-2] = 0x101f9f;
    cp[-1] = 0;
    iVar4 = m256v_LU_decomp_inplace((m256v *)&X1.e,rp,cp);
    if ((char)Y.e == '\0') {
      puVar9 = (uint8_t *)((long)cp - uVar5);
      builtin_memcpy(puVar9 + -8,"\x11 \x10",4);
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      rand_coeffs(puVar9,N_00,mask);
      puVar9[-8] = '\x04';
      puVar9[-7] = '\0';
      puVar9[-6] = '\0';
      puVar9[-5] = '\0';
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      builtin_memcpy(puVar9 + -8,"& \x10",4);
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      m256v_make((m256v *)&X.e,n_col,(int)*(undefined8 *)(puVar9 + -8),puVar9);
      Y.e._4_4_ = iVar4;
      builtin_memcpy(puVar9 + -8,"N \x10",4);
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      m256v_LU_invmult((m256v *)&X1.e,iVar4,rp,cp,(m256v *)local_78,(m256v *)&X.e);
      local_78._0_4_ = n_col;
      for (r1 = 0; iVar4 = Y.e._4_4_, iVar10 != r1; r1 = r1 + 1) {
        builtin_memcpy(puVar9 + -8,"s \x10",4);
        puVar9[-4] = '\0';
        puVar9[-3] = '\0';
        puVar9[-2] = '\0';
        puVar9[-1] = '\0';
        m256v_copy_row((m256v *)&X.e,r1,(m256v *)local_78,r1);
      }
    }
    else {
      piVar11 = (int *)((long)cp - uVar7);
      piVar11[-2] = 0x101fcc;
      piVar11[-1] = 0;
      perm_invert(n_col,cp,piVar11);
      local_78._0_4_ = n_row_00;
      piVar11[-2] = 0x101fec;
      piVar11[-1] = 0;
      m256v_LU_invmult_inplace((m256v *)&X1.e,iVar4,rp,piVar11,(m256v *)local_78);
      local_78._0_4_ = n_col;
    }
    cp[-2] = 0x102096;
    cp[-1] = 0;
    m256v_add_inplace((m256v *)local_110,(m256v *)local_78);
    if (iVar4 < n_col) {
      piVar11 = (int *)((long)cp - uVar6);
      piVar11[-2] = 0x1020bd;
      piVar11[-1] = 0;
      perm_invert(n_row,rp,piVar11);
      piVar11[-2] = 0x1020de;
      piVar11[-1] = 0;
      local_78._0_4_ = n_row_00;
      m256v_LU_mult_inplace((m256v *)&X1.e,piVar11,cp,(m256v *)local_78);
      local_78._0_4_ = n_row;
    }
    cp[-2] = 0x1020f1;
    cp[-1] = 0;
    iVar4 = m256v_iszero((m256v *)local_78);
    if (iVar4 == 0) {
      cp[-2] = 0x102134;
      cp[-1] = 0;
      fprintf(_stderr,"Error:  LU inversion gave wrong result. (field=%d, it=%d)\n",(ulong)(uint)N,
              (ulong)uVar8);
      goto LAB_0010213b;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static bool test_lu_invmul_x(bool inplace, int n_row, int n_col, int N, int field)
{
	const int maxdim = (n_row > n_col ? n_row : n_col);
	const int data_width = 4;
	const uint8_t mask = get_mask(field);

	int ntest = 0;
	for (int i = 0; i < N; ++i) {
		/* Create a random matrix & testing data */
		Def_mat256_rand(A, a, n_row, n_col, mask)
		Def_mat256_rand(X, x, n_col, data_width, mask)

		/* Compute Y := A*X the direct way */
		m256v_Def(Y, y, maxdim, data_width)
		Y.n_row = n_row;
		m256v_mul(&A, &X, &Y);

		/* Calculate LU decomposition */
		int rp[n_row], cp[n_col];
		const int rank = m256v_LU_decomp_inplace(&A, rp, cp);
		++ntest;

		/* Reconstruct X from LU and Y.
		 *
		 * This is not completely possible if the rank of the
		 * matrix is not full.  In such cases, we check if the
		 * difference of X with its reconstructed version is in
		 * the kernel of A.
		 */
		if (inplace) {
			int inv_cp[n_col];
			perm_invert(n_col, cp, inv_cp);

			Y.n_row = maxdim;
			m256v_LU_invmult_inplace(&A, rank, rp, inv_cp, &Y);
			Y.n_row = n_col;
		} else {
			Def_mat256_rand(X1, x1, n_col, data_width, mask)
			m256v_LU_invmult(&A, rank, rp, cp, &Y, &X1);

			/* Copy result back into Y */
			Y.n_row = n_col;
			for (int i = 0; i < n_col; ++i)
				m256v_copy_row(&X1, i, &Y, i);
		}

		/* Check the result */
		m256v_add_inplace(&X, &Y);
		if (rank < n_col) {
			/* If the matrix is not full rank, the resulting
			 * difference is not necessarily zero, but it
			 * must be in the kernel of A.
			 */
			int inv_rp[n_row];
			perm_invert(n_row, rp, inv_rp);
			Y.n_row = maxdim;
			m256v_LU_mult_inplace(&A, inv_rp, cp, &Y);
			Y.n_row = n_row;
		}
		if (!m256v_iszero(&Y)) {
			fprintf(stderr, "Error:  LU inversion gave "
			  "wrong result. (field=%d, it=%d)\n", field, i);
			return false;
		}
	}

	return true;
}